

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::batch_normalize_inference
               (double eps,resizable_tensor *dest,tensor *src,tensor *gamma,tensor *beta,
               tensor *running_means,tensor *running_variances)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar8;
  fatal_error *this;
  long lVar9;
  long lVar10;
  size_t new_size;
  long lVar11;
  long lVar12;
  double dVar13;
  ostringstream dlib_o_out;
  long local_1e8;
  long local_1e0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  if (((((((gamma->m_n == 1) && (lVar12 = gamma->m_nr, lVar12 == src->m_nr)) &&
         (lVar9 = gamma->m_nc, lVar9 == src->m_nc)) &&
        ((lVar10 = gamma->m_k, lVar10 == src->m_k && (beta->m_n == 1)))) &&
       ((lVar10 == beta->m_k && ((lVar12 == beta->m_nr && (lVar9 == beta->m_nc)))))) &&
      (running_means->m_n == 1)) &&
     ((((lVar10 == running_means->m_k && (lVar12 == running_means->m_nr)) &&
       (lVar9 == running_means->m_nc)) &&
      (((running_variances->m_n == 1 && (lVar10 == running_variances->m_k)) &&
       ((lVar12 == running_variances->m_nr && ((0.0 < eps && (lVar9 == running_variances->m_nc))))))
      )))) {
    lVar11 = src->m_n;
    (dest->super_tensor).m_n = lVar11;
    (dest->super_tensor).m_k = lVar10;
    (dest->super_tensor).m_nr = lVar12;
    (dest->super_tensor).m_nc = lVar9;
    new_size = lVar10 * lVar11 * lVar9 * lVar12;
    (dest->super_tensor).m_size = new_size;
    gpu_data::set_size(&dest->data_instance,new_size);
    iVar4 = (*(dest->super_tensor)._vptr_tensor[3])(dest);
    local_1e0 = CONCAT44(extraout_var,iVar4);
    iVar4 = (*src->_vptr_tensor[2])(src);
    local_1e8 = CONCAT44(extraout_var_00,iVar4);
    iVar4 = (*gamma->_vptr_tensor[2])(gamma);
    iVar5 = (*beta->_vptr_tensor[2])(beta);
    iVar6 = (*running_means->_vptr_tensor[2])(running_means);
    iVar7 = (*running_variances->_vptr_tensor[2])(running_variances);
    lVar12 = src->m_n;
    if (0 < lVar12) {
      lVar10 = src->m_nr * src->m_k * src->m_nc;
      lVar9 = 0;
      do {
        if (0 < lVar10) {
          lVar11 = 0;
          lVar12 = 0;
          do {
            fVar1 = *(float *)(local_1e8 + lVar12 * 4);
            fVar2 = *(float *)(CONCAT44(extraout_var_03,iVar6) + lVar12 * 4);
            fVar3 = *(float *)(CONCAT44(extraout_var_01,iVar4) + lVar12 * 4);
            dVar13 = (double)*(float *)(CONCAT44(extraout_var_04,iVar7) + lVar12 * 4) + eps;
            if (dVar13 < 0.0) {
              dVar13 = sqrt(dVar13);
            }
            else {
              dVar13 = SQRT(dVar13);
            }
            *(float *)(local_1e0 + lVar12 * 4) =
                 (float)((double)*(float *)(CONCAT44(extraout_var_02,iVar5) + lVar12 * 4) +
                        (double)((fVar1 - fVar2) * fVar3) / dVar13);
            lVar12 = lVar12 + 1;
            lVar11 = lVar11 + -4;
          } while (lVar10 - lVar12 != 0);
          lVar12 = src->m_n;
          local_1e0 = local_1e0 - lVar11;
          local_1e8 = local_1e8 - lVar11;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < lVar12);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar8 = (ostream *)std::ostream::operator<<(local_1a8,0x2ae);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::cpu::batch_normalize_inference(const double, resizable_tensor &, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &)"
             ,0x9b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "gamma.num_samples() == 1 && gamma.nr() == src.nr() && gamma.nc() == src.nc() && gamma.k() == src.k() && have_same_dimensions(gamma, beta) && have_same_dimensions(gamma, running_means) && have_same_dimensions(gamma, running_variances) && eps > 0"
             ,0xf4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a8._0_8_ + -0x18) + (long)(local_1a8 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\ngamma.num_samples(): ",0x16);
  poVar8 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\ngamma.k():  ",0xd);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\ngamma.nr(): ",0xd);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\ngamma.nc(): ",0xd);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nbeta.num_samples(): ",0x15);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nbeta.k():   ",0xd);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nbeta.nr():  ",0xd);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nbeta.nc():  ",0xd);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_means.num_samples(): ",0x1e);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_means.k():   ",0x16);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_means.nr():  ",0x16);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_means.nc():  ",0x16);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"\nrunning_variances.num_samples(): ",0x22);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_variances.k():   ",0x1a);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_variances.nr():  ",0x1a);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nrunning_variances.nc():  ",0x1a);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nsrc.k():   ",0xc);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nsrc.nr():  ",0xc);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nsrc.nc():  ",0xc);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\neps:  ",7);
  poVar8 = std::ostream::_M_insert<double>(eps);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void batch_normalize_inference (
            const double eps,
            resizable_tensor& dest,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta,
            const tensor& running_means,
            const tensor& running_variances
        )
        {
            DLIB_CASSERT(
                gamma.num_samples() == 1 && 
                gamma.nr() == src.nr() &&
                gamma.nc() == src.nc() &&
                gamma.k()  == src.k() &&
                have_same_dimensions(gamma, beta) &&
                have_same_dimensions(gamma, running_means) &&
                have_same_dimensions(gamma, running_variances) && 
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nrunning_means.num_samples(): " << running_means.num_samples() << 
                "\nrunning_means.k():   " << running_means.k() << 
                "\nrunning_means.nr():  " << running_means.nr() << 
                "\nrunning_means.nc():  " << running_means.nc() << 
                "\nrunning_variances.num_samples(): " << running_variances.num_samples() << 
                "\nrunning_variances.k():   " << running_variances.k() << 
                "\nrunning_variances.nr():  " << running_variances.nr() << 
                "\nrunning_variances.nc():  " << running_variances.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );
            dest.copy_size(src);

            auto d = dest.host();
            auto s = src.host();
            auto g = gamma.host();
            auto b = beta.host();
            auto m = running_means.host();
            auto v = running_variances.host();

            const long num = src.k()*src.nr()*src.nc();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long k = 0; k < num; ++k)
                {
                    *d = g[k]*(*s - m[k])/std::sqrt(v[k]+eps) + b[k];
                    ++d;
                    ++s;
                }
            }
        }